

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O3

void __thiscall
UtestShell::assertTrue
          (UtestShell *this,bool condition,char *checkString,char *conditionString,char *text,
          char *fileName,size_t lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  TestFailure local_98;
  TestResult *pTVar2;
  
  pTVar2 = testResult_;
  if (testResult_ == (TestResult *)0x0) {
    OutsideTestRunnerUTest::instance();
    iVar1 = (*OutsideTestRunnerUTest::instance::instance_.super_UtestShell._vptr_UtestShell[0x2a])
                      (&OutsideTestRunnerUTest::instance::instance_);
    pTVar2 = (TestResult *)CONCAT44(extraout_var,iVar1);
  }
  (*pTVar2->_vptr_TestResult[10])();
  if (!condition) {
    SimpleString::SimpleString(&local_b8,checkString);
    SimpleString::SimpleString(&local_c8,conditionString);
    SimpleString::SimpleString(&local_a8,text);
    CheckFailure::CheckFailure
              ((CheckFailure *)&local_98,this,fileName,lineNumber,&local_b8,&local_c8,&local_a8);
    (*this->_vptr_UtestShell[0x27])(this,&local_98,testTerminator);
    TestFailure::~TestFailure(&local_98);
    SimpleString::~SimpleString(&local_a8);
    SimpleString::~SimpleString(&local_c8);
    SimpleString::~SimpleString(&local_b8);
  }
  return;
}

Assistant:

void UtestShell::assertTrue(bool condition, const char *checkString, const char *conditionString, const char* text, const char *fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (!condition)
        failWith(CheckFailure(this, fileName, lineNumber, checkString, conditionString, text), testTerminator);
}